

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode curl_mime_encoder(curl_mimepart *part,char *encoding)

{
  int iVar1;
  CURLcode CVar2;
  char *second;
  mime_encoder *pmVar3;
  
  if (part == (curl_mimepart *)0x0) {
    CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    part->encoder = (mime_encoder *)0x0;
    if (encoding == (char *)0x0) {
      CVar2 = CURLE_OK;
    }
    else {
      CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
      pmVar3 = encoders;
      second = "binary";
      do {
        iVar1 = Curl_strcasecompare(encoding,second);
        if (iVar1 != 0) {
          part->encoder = pmVar3;
          CVar2 = CURLE_OK;
        }
        second = pmVar3[1].name;
        pmVar3 = pmVar3 + 1;
      } while (second != (char *)0x0);
    }
  }
  return CVar2;
}

Assistant:

CURLcode curl_mime_encoder(curl_mimepart *part, const char *encoding)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
  const struct mime_encoder *mep;

  if(!part)
    return result;

  part->encoder = NULL;

  if(!encoding)
    return CURLE_OK;    /* Removing current encoder. */

  for(mep = encoders; mep->name; mep++)
    if(strcasecompare(encoding, mep->name)) {
      part->encoder = mep;
      result = CURLE_OK;
    }

  return result;
}